

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_pedersen_verify_tally
              (secp256k1_context *ctx,secp256k1_pedersen_commitment **pos,size_t n_pos,
              secp256k1_pedersen_commitment **neg,size_t n_neg)

{
  size_t sVar1;
  secp256k1_gej accj;
  secp256k1_ge add;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  local_108.infinity = 1;
  local_108.x.n[0] = 0;
  local_108.x.n[1] = 0;
  local_108.x.n[2] = 0;
  local_108.x.n[3] = 0;
  local_108.x.n[4] = 0;
  local_108.y.n[0] = 0;
  local_108.y.n[1] = 0;
  local_108.y.n[2] = 0;
  local_108.y.n[3] = 0;
  local_108.y.n[4] = 0;
  local_108.z.n[0] = 0;
  local_108.z.n[1] = 0;
  local_108.z.n[2] = 0;
  local_108.z.n[3] = 0;
  local_108.z.n[4] = 0;
  if (n_neg != 0) {
    sVar1 = 0;
    do {
      secp256k1_pedersen_commitment_load(&local_88,neg[sVar1]);
      secp256k1_gej_add_ge_var(&local_108,&local_108,&local_88,(secp256k1_fe *)0x0);
      sVar1 = sVar1 + 1;
    } while (n_neg != sVar1);
  }
  secp256k1_gej_neg(&local_108,&local_108);
  if (n_pos != 0) {
    sVar1 = 0;
    do {
      secp256k1_pedersen_commitment_load(&local_88,pos[sVar1]);
      secp256k1_gej_add_ge_var(&local_108,&local_108,&local_88,(secp256k1_fe *)0x0);
      sVar1 = sVar1 + 1;
    } while (n_pos != sVar1);
  }
  return local_108.infinity;
}

Assistant:

int secp256k1_pedersen_verify_tally(const secp256k1_context* ctx, const secp256k1_pedersen_commitment * const* pos, size_t n_pos, const secp256k1_pedersen_commitment * const* neg, size_t n_neg) {
    secp256k1_gej accj;
    secp256k1_ge add;
    size_t i;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(!n_pos || (pos != NULL));
    ARG_CHECK(!n_neg || (neg != NULL));
    (void) ctx;
    secp256k1_gej_set_infinity(&accj);
    for (i = 0; i < n_neg; i++) {
        secp256k1_pedersen_commitment_load(&add, neg[i]);
        secp256k1_gej_add_ge_var(&accj, &accj, &add, NULL);
    }
    secp256k1_gej_neg(&accj, &accj);
    for (i = 0; i < n_pos; i++) {
        secp256k1_pedersen_commitment_load(&add, pos[i]);
        secp256k1_gej_add_ge_var(&accj, &accj, &add, NULL);
    }
    return secp256k1_gej_is_infinity(&accj);
}